

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::WeightConstraint::integrateRoot(WeightConstraint *this,Solver *s)

{
  WL WVar1;
  WL *pWVar2;
  pointer puVar3;
  pointer pLVar4;
  GenericWatch *pGVar5;
  uint uVar6;
  uint uVar7;
  uint32 i;
  uint32 uVar8;
  uint uVar9;
  int iVar10;
  
  uVar9 = (s->levels_).super_type.ebo_.size;
  if (uVar9 != 0) {
    uVar7 = *(uint *)&this->field_0x10 & 0x7ffffff;
    pWVar2 = this->lits_;
    WVar1 = *pWVar2;
    uVar6 = 0;
    if (uVar7 != (uint)WVar1 >> 0x1f) {
      uVar6 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                       (ulong)((uint)pWVar2[(ulong)(((uint)this->bound_[(ulong)uVar7 + 1] >> 2) <<
                                                   (WVar1._3_1_ >> 7)) + 1] & 0xfffffffc)) >> 4;
    }
    if ((uVar6 < (s->levels_).root) && ((s->conflict_).ebo_.size == 0)) {
      if (((uint)WVar1 & 0x3fffffff) == 0) {
        iVar10 = 0;
      }
      else {
        puVar3 = (s->assign_).assign_.ebo_.buf;
        iVar10 = 0;
        uVar6 = 0;
        do {
          uVar7 = *(uint *)((long)puVar3 +
                           (ulong)((uint)pWVar2[(ulong)(uVar6 << (SUB41(*pWVar2,3) >> 7)) + 1] &
                                  0xfffffffc));
          if (0xf < uVar7 && (uVar7 & 3) != 0) {
            iVar10 = iVar10 + 1;
            puVar3[(uint)pWVar2[(ulong)(uVar6 << (SUB41(*pWVar2,3) >> 7)) + 1] >> 2] = uVar7 | 0xc;
            if (uVar7 >> 4 < uVar9) {
              uVar9 = uVar7 >> 4;
            }
          }
          uVar6 = uVar6 + 1;
        } while (((uint)WVar1 & 0x3fffffff) != uVar6);
      }
      uVar8 = (s->assign_).front;
      uVar9 = *(uint *)((s->levels_).super_type.ebo_.buf + (uVar9 - 1)) & 0x3fffffff;
      if (iVar10 != 0 && uVar9 != uVar8) {
        do {
          pLVar4 = (s->assign_).trail.ebo_.buf;
          puVar3 = (s->assign_).assign_.ebo_.buf;
          uVar6 = pLVar4[uVar9].rep_;
          uVar7 = *(uint *)((long)puVar3 + (ulong)(uVar6 & 0xfffffffc));
          if (((uVar6 & 2) * 2 + 4 & uVar7) != 0) {
            iVar10 = iVar10 + -1;
            puVar3[uVar6 >> 2] = uVar7 & 0xfffffff3;
            if (((s->conflict_).ebo_.size == 0) &&
               (pGVar5 = Solver::getWatch(s,(Literal)pLVar4[uVar9].rep_,&this->super_Constraint),
               pGVar5 != (GenericWatch *)0x0)) {
              (**pGVar5->con->_vptr_Constraint)(pGVar5->con,s,(ulong)uVar6,&pGVar5->data);
            }
          }
        } while ((uVar8 - 1 != uVar9) && (uVar9 = uVar9 + 1, iVar10 != 0));
      }
      if (iVar10 != 0 && uVar8 != (s->assign_).trail.ebo_.size) {
        pLVar4 = (s->assign_).trail.ebo_.buf;
        puVar3 = (s->assign_).assign_.ebo_.buf;
        do {
          uVar9 = pLVar4[uVar8].rep_;
          uVar6 = *(uint *)((long)puVar3 + (ulong)(uVar9 & 0xfffffffc));
          if ((uVar6 & 0xc) != 0) {
            iVar10 = iVar10 + -1;
            puVar3[uVar9 >> 2] = uVar6 & 0xfffffff3;
          }
          uVar8 = uVar8 + 1;
        } while ((uVar8 != (s->assign_).trail.ebo_.size) && (iVar10 != 0));
      }
    }
  }
  return (s->conflict_).ebo_.size == 0;
}

Assistant:

bool WeightConstraint::integrateRoot(Solver& s) {
	if (!s.decisionLevel() || highestUndoLevel(s) >= s.rootLevel() || s.hasConflict()) { return !s.hasConflict(); }
	// check if constraint has assigned literals
	uint32 low = s.decisionLevel(), vDL;
	uint32 np  = 0;
	for (uint32 i = 0, end = size(); i != end; ++i) {
		Var v = lits_->var(i);
		if (s.value(v) != value_free && (vDL = s.level(v)) != 0) {
			++np;
			s.markSeen(v);
			low = std::min(low, vDL);
		}
	}
	// propagate assigned literals in assignment order
	const LitVec& trail = s.trail();
	const uint32  end   = sizeVec(trail) - s.queueSize();
	GenericWatch* w     = 0;
	for (uint32 i = s.levelStart(low); i != end && np; ++i) {
		Literal p = trail[i];
		if (s.seen(p) && np--) {
			s.clearSeen(p.var());
			if (!s.hasConflict() && (w = s.getWatch(trail[i], this)) != 0) {
				w->propagate(s, p);
			}
		}
	}
	for (uint32 i = end; i != trail.size() && np; ++i) {
		if (s.seen(trail[i].var())) { --np; s.clearSeen(trail[i].var()); }
	}
	return !s.hasConflict();
}